

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

ImageT<unsigned_short,_4U> * __thiscall
ImageT<unsigned_short,_4U>::swizzle(ImageT<unsigned_short,_4U> *this,string_view swizzle)

{
  unsigned_short val;
  uint32_t uVar1;
  uint uVar2;
  size_type sVar3;
  ImageT<unsigned_short,_4U> *in_RDI;
  uint32_t c;
  Color srcPixel;
  size_t i;
  char in_stack_ffffffffffffffaf;
  Color *srcPixel_00;
  uint uVar4;
  uint local_2c;
  ulong local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  if (sVar3 == 4) {
    local_20 = 0;
    while( true ) {
      uVar1 = Image::getPixelCount(&in_RDI->super_Image);
      if (uVar1 <= local_20) break;
      local_2c = 0;
      while( true ) {
        uVar4 = local_2c;
        uVar2 = (*(in_RDI->super_Image)._vptr_Image[5])();
        if (uVar2 <= uVar4) break;
        srcPixel_00 = in_RDI->pixels + local_20;
        uVar2 = local_2c;
        std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_10,(ulong)local_2c)
        ;
        val = swizzlePixel((ImageT<unsigned_short,_4U> *)CONCAT44(uVar4,uVar2),srcPixel_00,
                           in_stack_ffffffffffffffaf);
        color<unsigned_short,_4U>::set(srcPixel_00,uVar2,val);
        local_2c = local_2c + 1;
      }
      local_20 = local_20 + 1;
    }
    return in_RDI;
  }
  __assert_fail("swizzle.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x4fe,
                "virtual ImageT<componentType, componentCount> &ImageT<unsigned short, 4>::swizzle(std::string_view) [componentType = unsigned short, componentCount = 4]"
               );
}

Assistant:

virtual ImageT& swizzle(std::string_view swizzle) override {
        assert(swizzle.size() == 4);
        for (size_t i = 0; i < getPixelCount(); i++) {
            Color srcPixel = pixels[i];
            for (uint32_t c = 0; c < getComponentCount(); c++) {
                pixels[i].set(c, swizzlePixel(srcPixel, swizzle[c]));
            }
        }
        return *this;
    }